

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

bool __thiscall soul::Value::operator==(Value *this,Value *other)

{
  bool bVar1;
  bool bVar2;
  PackedData local_50;
  PackedData local_38;
  
  if ((this->type).category == invalid) {
    bVar2 = (other->type).category == invalid;
  }
  else {
    bVar2 = false;
    bVar1 = Type::isEqual(&this->type,&other->type,0);
    if (bVar1) {
      getData(&local_38,this);
      getData(&local_50,other);
      bVar2 = PackedData::equals(&local_38,&local_50);
    }
  }
  return bVar2;
}

Assistant:

bool Value::operator== (const Value& other) const
{
    if (! type.isValid())
        return ! other.type.isValid();

    return type.isIdentical (other.type) && getData().equals (other.getData());
}